

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

void altersingle(nn_quant *nnq,int alpha,int i,int al,int b,int g,int r)

{
  int *piVar1;
  nq_pixel *paiVar2;
  int *n;
  int g_local;
  int b_local;
  int al_local;
  int i_local;
  int alpha_local;
  nn_quant *nnq_local;
  
  paiVar2 = nnq->network + i;
  (*paiVar2)[0] = (*paiVar2)[0] - (alpha * ((*paiVar2)[0] - al)) / 0x400;
  piVar1 = *paiVar2 + 1;
  *piVar1 = *piVar1 - (alpha * (*piVar1 - b)) / 0x400;
  piVar1 = *paiVar2 + 2;
  *piVar1 = *piVar1 - (alpha * (*piVar1 - g)) / 0x400;
  piVar1 = *paiVar2 + 3;
  *piVar1 = *piVar1 - (alpha * (*piVar1 - r)) / 0x400;
  return;
}

Assistant:

void altersingle(nnq, alpha,i,al,b,g,r)
nn_quant *nnq;
register int alpha,i,al,b,g,r;
{
	register int *n;

	n = nnq->network[i];	/* alter hit neuron */
	*n -= (alpha*(*n - al)) / initalpha;
	n++;
	*n -= (alpha*(*n - b)) / initalpha;
	n++;
	*n -= (alpha*(*n - g)) / initalpha;
	n++;
	*n -= (alpha*(*n - r)) / initalpha;
}